

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O2

byte * __thiscall
Js::ByteCodeBufferReader::ReadAuxiliary
          (ByteCodeBufferReader *this,byte *buffer,FunctionBody *functionBody)

{
  code *pcVar1;
  FunctionBody *this_00;
  bool bVar2;
  byte *pbVar3;
  undefined4 *puVar4;
  ByteBlock *ptr;
  uint uVar5;
  uint local_4c;
  FunctionBody *pFStack_48;
  uint32 sizeOfAuxiliaryBlock;
  uint local_40;
  uint local_3c;
  uint32 countOfAuxiliaryStructure;
  uint32 sizeOfAuxiliaryContextBlock;
  
  pFStack_48 = functionBody;
  pbVar3 = ReadUInt32(this,buffer,&local_40);
  if (local_40 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                ,0xb8b,"(countOfAuxiliaryStructure != 0)",
                                "countOfAuxiliaryStructure != 0");
    if (!bVar2) {
LAB_007c492c:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  pbVar3 = ReadUInt32(this,pbVar3,&local_4c);
  pbVar3 = ReadUInt32(this,pbVar3,&local_3c);
  if (local_4c == 0) {
    ptr = (ByteBlock *)0x0;
  }
  else {
    ptr = ByteBlock::New(this->scriptContext->recycler,(byte *)0x0,local_4c);
  }
  uVar5 = 0;
  if (local_3c == 0) {
    _countOfAuxiliaryStructure = (ByteBlock *)0x0;
  }
  else {
    _countOfAuxiliaryStructure = ByteBlock::New(this->scriptContext->recycler,(byte *)0x0,local_3c);
  }
  do {
    this_00 = pFStack_48;
    if (local_40 <= uVar5) {
      FunctionProxy::SetAuxPtr<(Js::FunctionProxy::AuxPointerType)15,Js::ByteBlock*>
                ((FunctionProxy *)pFStack_48,ptr);
      FunctionProxy::SetAuxPtr<(Js::FunctionProxy::AuxPointerType)16,Js::ByteBlock*>
                ((FunctionProxy *)this_00,_countOfAuxiliaryStructure);
      return pbVar3;
    }
    switch(pbVar3[4]) {
    case '\x01':
      pbVar3 = DeserializeVarArray<Js::AuxArray<void*>>(this,this->scriptContext,pbVar3,ptr);
      break;
    case '\x02':
      pbVar3 = DeserializeVarArray<Js::VarArrayVarCount>
                         (this,this->scriptContext,pbVar3,_countOfAuxiliaryStructure);
      break;
    case '\x03':
      pbVar3 = DeserializePropertyIdArray(this,this->scriptContext,pbVar3,ptr,pFStack_48);
      break;
    case '\x04':
      pbVar3 = DeserializeFuncInfoArray(this,this->scriptContext,pbVar3,ptr);
      break;
    case '\x05':
      pbVar3 = DeserializeIntArray(this,this->scriptContext,pbVar3,ptr);
      break;
    case '\x06':
      pbVar3 = DeserializeFloatArray(this,this->scriptContext,pbVar3,ptr);
      break;
    default:
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                  ,0xba1,"(false)","Unexpected auxiliary kind");
      if (bVar2) {
        *puVar4 = 0;
        Throw::FatalInternalError(-0x7fffbffb);
      }
      goto LAB_007c492c;
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

const byte * ReadAuxiliary(const byte * buffer, FunctionBody * functionBody)
    {
        const byte * current = buffer;
        uint32 countOfAuxiliaryStructure;
        current = ReadUInt32(current, &countOfAuxiliaryStructure);
        Assert(countOfAuxiliaryStructure != 0);

        uint32 sizeOfAuxiliaryBlock;
        uint32 sizeOfAuxiliaryContextBlock;
        current = ReadUInt32(current, &sizeOfAuxiliaryBlock);
        current = ReadUInt32(current, &sizeOfAuxiliaryContextBlock);

        ByteBlock * auxBlock = sizeOfAuxiliaryBlock?
            ByteBlock::New(scriptContext->GetRecycler(), nullptr, sizeOfAuxiliaryBlock) : nullptr;
        ByteBlock * auxContextBlock = sizeOfAuxiliaryContextBlock?
            ByteBlock::New(scriptContext->GetRecycler(), nullptr, sizeOfAuxiliaryContextBlock) : nullptr;

        for (uint i = 0; i < countOfAuxiliaryStructure; i++)
        {
            typedef serialization_alignment const SerializedAuxiliary TBase;
            auto part = (serialization_alignment const SerializedAuxiliary * )current;
#ifdef BYTE_CODE_MAGIC_CONSTANTS
            Assert(part->auxMagic == magicStartOfAux);
#endif
            switch(part->kind)
            {
            default:
                AssertMsg(false, "Unexpected auxiliary kind");
                Throw::FatalInternalError();
                break;

            case sakVarArrayIntCount:
                current = DeserializeVarArray<VarArray>(scriptContext, current, auxBlock);
                break;

            case sakVarArrayVarCount:
                current = DeserializeVarArray<VarArrayVarCount>(scriptContext, current, auxContextBlock);
                break;

            case sakIntArray:
                current = DeserializeIntArray(scriptContext, current, auxBlock);
                break;

            case sakFloatArray:
                current = DeserializeFloatArray(scriptContext, current, auxBlock);
                break;

            case sakPropertyIdArray:
                current = DeserializePropertyIdArray(scriptContext, current, auxBlock, functionBody);
                break;

            case sakFuncInfoArray:
                current = DeserializeFuncInfoArray(scriptContext, current, auxBlock);
                break;
            }
#ifdef BYTE_CODE_MAGIC_CONSTANTS
            int magicEnd;
            current = ReadInt32(current, &magicEnd);
            Assert(magicEnd == magicEndOfAux);
#endif
        }
        functionBody->SetAuxiliaryData(auxBlock);
        functionBody->SetAuxiliaryContextData(auxContextBlock);

        return current;
    }